

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_adaptor_sig_deserialize
              (secp256k1_ge *r,secp256k1_scalar *sigr,secp256k1_ge *rp,secp256k1_scalar *sp,
              secp256k1_scalar *dleq_proof_e,secp256k1_scalar *dleq_proof_s,uchar *adaptor_sig162)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  secp256k1_scalar *in_RSI;
  long in_RDI;
  secp256k1_scalar *in_R8;
  uchar *in_R9;
  int overflow;
  uchar *in_stack_00000040;
  secp256k1_ge *in_stack_00000048;
  uchar *in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc2;
  undefined1 uVar2;
  int in_stack_ffffffffffffffc4;
  int local_4;
  
  uVar2 = 1;
  if (in_RDI != 0) {
    in_stack_ffffffffffffffc2 = in_RDI != 0 && in_RSI != (secp256k1_scalar *)0x0;
    uVar2 = in_stack_ffffffffffffffc2;
    iVar1 = secp256k1_eckey_pubkey_parse(in_stack_00000048,in_stack_00000040,(size_t)r);
    if (iVar1 == 0) {
      return 0;
    }
  }
  if (in_RSI != (secp256k1_scalar *)0x0) {
    secp256k1_scalar_set_b32
              (in_R8,in_R9,
               (int *)CONCAT44(in_stack_ffffffffffffffc4,
                               CONCAT13(uVar2,CONCAT12(in_stack_ffffffffffffffc2,
                                                       in_stack_ffffffffffffffc0))));
    iVar1 = secp256k1_scalar_is_zero(in_RSI);
    if (iVar1 != 0) {
      return 0;
    }
  }
  if ((in_RDX == 0) ||
     (iVar1 = secp256k1_eckey_pubkey_parse(in_stack_00000048,in_stack_00000040,(size_t)r),
     iVar1 != 0)) {
    if ((in_RCX == 0) ||
       (iVar1 = secp256k1_scalar_set_b32_seckey
                          ((secp256k1_scalar *)
                           CONCAT44(in_stack_ffffffffffffffc4,
                                    CONCAT13(uVar2,CONCAT12(in_stack_ffffffffffffffc2,
                                                            in_stack_ffffffffffffffc0))),
                           in_stack_ffffffffffffffb8), iVar1 != 0)) {
      if (in_R8 != (secp256k1_scalar *)0x0) {
        secp256k1_scalar_set_b32
                  (in_R8,in_R9,
                   (int *)CONCAT44(in_stack_ffffffffffffffc4,
                                   CONCAT13(uVar2,CONCAT12(in_stack_ffffffffffffffc2,
                                                           in_stack_ffffffffffffffc0))));
      }
      if ((in_R9 == (uchar *)0x0) ||
         (secp256k1_scalar_set_b32
                    (in_R8,in_R9,
                     (int *)CONCAT44(in_stack_ffffffffffffffc4,
                                     CONCAT13(uVar2,CONCAT12(in_stack_ffffffffffffffc2,
                                                             in_stack_ffffffffffffffc0)))),
         in_stack_ffffffffffffffc4 == 0)) {
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int secp256k1_ecdsa_adaptor_sig_deserialize(secp256k1_ge *r, secp256k1_scalar *sigr, secp256k1_ge *rp, secp256k1_scalar *sp, secp256k1_scalar *dleq_proof_e, secp256k1_scalar *dleq_proof_s, const unsigned char *adaptor_sig162) {
    /* If r is deserialized, require that a sigr is provided to receive
     * the X-coordinate */
    VERIFY_CHECK((r == NULL) || (r != NULL && sigr != NULL));
    if (r != NULL) {
        if (!secp256k1_eckey_pubkey_parse(r, &adaptor_sig162[0], 33)) {
            return 0;
        }
    }
    if (sigr != NULL) {
        secp256k1_scalar_set_b32(sigr, &adaptor_sig162[1], NULL);
        if (secp256k1_scalar_is_zero(sigr)) {
            return 0;
        }
    }
    if (rp != NULL) {
        if (!secp256k1_eckey_pubkey_parse(rp, &adaptor_sig162[33], 33)) {
            return 0;
        }
    }
    if (sp != NULL) {
        if (!secp256k1_scalar_set_b32_seckey(sp, &adaptor_sig162[66])) {
            return 0;
        }
    }
    if (dleq_proof_e != NULL) {
        secp256k1_scalar_set_b32(dleq_proof_e, &adaptor_sig162[98], NULL);
    }
    if (dleq_proof_s != NULL) {
        int overflow;
        secp256k1_scalar_set_b32(dleq_proof_s, &adaptor_sig162[130], &overflow);
        if (overflow) {
            return 0;
        }
    }
    return 1;
}